

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O1

size_t __thiscall
andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
          (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t vertexIndex0,
          size_t vertexIndex1)

{
  pointer *ppEVar1;
  pointer pRVar2;
  pointer pAVar3;
  iterator __position;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  pointer pAVar7;
  difference_type __d;
  ulong uVar8;
  size_t sVar9;
  Edge<false,_unsigned_long> local_20;
  
  if (this->multipleEdgesEnabled_ != true) {
    pRVar2 = (this->vertices_).
             super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar9 = vertexIndex0;
    uVar4 = vertexIndex1;
    if ((ulong)((long)*(pointer *)
                       ((long)&pRVar2[vertexIndex1].vector_.
                               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       + 8) -
               *(long *)&pRVar2[vertexIndex1].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               ) <
        (ulong)((long)*(pointer *)
                       ((long)&pRVar2[vertexIndex0].vector_.
                               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       + 8) -
               *(long *)&pRVar2[vertexIndex0].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               )) {
      sVar9 = vertexIndex1;
      uVar4 = vertexIndex0;
    }
    pAVar7 = *(pointer *)
              &pRVar2[sVar9].vector_.
               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
    ;
    pAVar3 = *(pointer *)
              ((long)&pRVar2[sVar9].vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
              + 8);
    uVar8 = (long)pAVar3 - (long)pAVar7 >> 4;
    while (uVar6 = uVar8, 0 < (long)uVar6) {
      uVar8 = uVar6 >> 1;
      if (pAVar7[uVar8].vertex_ < uVar4) {
        pAVar7 = pAVar7 + uVar8 + 1;
        uVar8 = ~uVar8 + uVar6;
      }
    }
    if ((pAVar3 == pAVar7) || (pAVar7->vertex_ != uVar4)) {
      bVar5 = false;
      sVar9 = 0;
    }
    else {
      sVar9 = pAVar7->edge_;
      bVar5 = true;
    }
    if (bVar5) {
      return sVar9;
    }
  }
  local_20.vertexIndices_[1] = vertexIndex1;
  if (vertexIndex1 < vertexIndex0) {
    local_20.vertexIndices_[1] = vertexIndex0;
    vertexIndex0 = vertexIndex1;
  }
  __position._M_current =
       (this->edges_).
       super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_20.vertexIndices_[0] = vertexIndex0;
  if (__position._M_current ==
      (this->edges_).
      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<andres::graph::detail::Edge<false,unsigned_long>,std::allocator<andres::graph::detail::Edge<false,unsigned_long>>>
    ::_M_realloc_insert<andres::graph::detail::Edge<false,unsigned_long>>
              ((vector<andres::graph::detail::Edge<false,unsigned_long>,std::allocator<andres::graph::detail::Edge<false,unsigned_long>>>
                *)&this->edges_,__position,&local_20);
  }
  else {
    (__position._M_current)->vertexIndices_[0] = vertexIndex0;
    (__position._M_current)->vertexIndices_[1] = local_20.vertexIndices_[1];
    ppEVar1 = &(this->edges_).
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  sVar9 = ((long)(this->edges_).
                 super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->edges_).
                 super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
  insertAdjacenciesForEdge(this,sVar9);
  return sVar9;
}

Assistant:

inline std::size_t
Graph<VISITOR>::insertEdge(
    const std::size_t vertexIndex0,
    const std::size_t vertexIndex1
) {
    assert(vertexIndex0 < numberOfVertices()); 
    assert(vertexIndex1 < numberOfVertices()); 
    
    if(multipleEdgesEnabled()) {
insertEdgeMark:
        edges_.push_back(Edge(vertexIndex0, vertexIndex1));
        std::size_t edgeIndex = edges_.size() - 1;
        insertAdjacenciesForEdge(edgeIndex);
        visitor_.insertEdge(edgeIndex);  
        return edgeIndex;
    }
    else {
        std::pair<bool, std::size_t> p = findEdge(vertexIndex0, vertexIndex1);
        if(p.first) { // edge already exists
            return p.second;
        }
        else {
            goto insertEdgeMark;
        }
    }
}